

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdApi.c
# Opt level: O1

int Cmd_CommandExecute(Abc_Frame_t *pAbc,char *sCommand)

{
  int iVar1;
  int loop;
  int argc;
  char **argv;
  int local_40;
  int local_3c;
  char **local_38;
  
  if ((pAbc->fAutoexac == 0) && (pAbc->fSource == 0)) {
    Cmd_HistoryAddCommand(pAbc,sCommand);
  }
  do {
    sCommand = CmdSplitLine(pAbc,sCommand,&local_3c,&local_38);
    local_40 = 0;
    iVar1 = CmdApplyAlias(pAbc,&local_3c,&local_38,&local_40);
    if (iVar1 == 0) {
      iVar1 = CmdCommandDispatch(pAbc,&local_3c,&local_38);
    }
    CmdFreeArgv(local_3c,local_38);
  } while ((iVar1 == 0) && (*sCommand != '\0'));
  return iVar1;
}

Assistant:

int Cmd_CommandExecute( Abc_Frame_t * pAbc, const char * sCommand )
{
    int fStatus = 0, argc, loop;
    const char * sCommandNext;
    char **argv;

    if ( !pAbc->fAutoexac && !pAbc->fSource ) 
	    Cmd_HistoryAddCommand(pAbc, sCommand);
    sCommandNext = sCommand;
    do 
    {
       	sCommandNext = CmdSplitLine( pAbc, sCommandNext, &argc, &argv );
		loop = 0;
		fStatus = CmdApplyAlias( pAbc, &argc, &argv, &loop );
		if ( fStatus == 0 ) 
			fStatus = CmdCommandDispatch( pAbc, &argc, &argv );
       	CmdFreeArgv( argc, argv );
    } 
    while ( fStatus == 0 && *sCommandNext != '\0' );
    return fStatus;
}